

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_1;
  NonAnsiUdpPortListSyntax *pNVar1;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::IdentifierNameSyntax>
                     ((SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NonAnsiUdpPortListSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,args_1,&local_48,&local_58);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NonAnsiUdpPortListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NonAnsiUdpPortListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.ports, alloc),
        node.closeParen.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}